

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<QString,_QVariant>_>::freeData
          (Span<QHashPrivate::Node<QString,_QVariant>_> *this)

{
  byte bVar1;
  void *pvVar2;
  Node<QString,_QVariant> *pNVar3;
  Node<QString,_QVariant> *in_RDI;
  uchar o;
  uchar *__end4;
  uchar *__begin4;
  uchar (*__range4) [128];
  Node<QString,_QVariant> *local_18;
  
  if (in_RDI[2].key.d.size != 0) {
    pNVar3 = in_RDI + 2;
    for (local_18 = in_RDI; local_18 != (Node<QString,_QVariant> *)&(pNVar3->key).d.size;
        local_18 = (Node<QString,_QVariant> *)((long)&(local_18->key).d.d + 1)) {
      bVar1 = *(byte *)&(local_18->key).d.d;
      if (bVar1 != 0xff) {
        Entry::node((Entry *)(in_RDI[2].key.d.size + (ulong)bVar1 * 0x38));
        Node<QString,_QVariant>::~Node(in_RDI);
      }
    }
    pvVar2 = (void *)in_RDI[2].key.d.size;
    if (pvVar2 != (void *)0x0) {
      operator_delete__(pvVar2);
    }
    in_RDI[2].key.d.size = 0;
  }
  return;
}

Assistant:

void freeData() noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (entries) {
            if constexpr (!std::is_trivially_destructible<Node>::value) {
                for (auto o : offsets) {
                    if (o != SpanConstants::UnusedEntry)
                        entries[o].node().~Node();
                }
            }
            delete[] entries;
            entries = nullptr;
        }
    }